

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrCol3f
          (X3DImporter *this,int pAttrIdx,vector<aiColor3D,_std::allocator<aiColor3D>_> *pValue)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  list<aiColor3D,_std::allocator<aiColor3D>_> tlist;
  _List_node_base local_30;
  size_type local_20;
  
  local_20 = 0;
  local_30._M_next = &local_30;
  local_30._M_prev = &local_30;
  XML_ReadNode_GetAttrVal_AsListCol3f
            (this,pAttrIdx,(list<aiColor3D,_std::allocator<aiColor3D>_> *)&local_30);
  if (local_30._M_next != &local_30) {
    std::vector<aiColor3D,_std::allocator<aiColor3D>_>::reserve(pValue,local_20);
    p_Var2 = &local_30;
    while (p_Var2 = p_Var2->_M_next, p_Var2 != &local_30) {
      std::vector<aiColor3D,_std::allocator<aiColor3D>_>::push_back
                (pValue,(value_type *)(p_Var2 + 1));
    }
  }
  p_Var2 = local_30._M_next;
  while (p_Var2 != &local_30) {
    p_Var1 = (((_List_base<aiColor3D,_std::allocator<aiColor3D>_> *)&p_Var2->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var2,0x20);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsArrCol3f(const int pAttrIdx, std::vector<aiColor3D>& pValue)
{
    std::list<aiColor3D> tlist;

	XML_ReadNode_GetAttrVal_AsListCol3f(pAttrIdx, tlist);// read as list
	// and copy to array
	if(!tlist.empty())
	{
		pValue.reserve(tlist.size());
		for(std::list<aiColor3D>::iterator it = tlist.begin(); it != tlist.end(); ++it) pValue.push_back(*it);
	}
}